

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

void fill_border(uint8_t *img_buf,int width,int height,int stride)

{
  byte *pbVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint8_t *row_start_2;
  int row_2;
  uint8_t *last_row_start;
  uint8_t *row_start_1;
  int row_1;
  uint8_t right_pixel;
  uint8_t left_pixel;
  uint8_t *row_start;
  int row;
  int local_3c;
  int local_28;
  int local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    pbVar1 = (byte *)(in_RDI + local_18 * in_ECX);
    memset(pbVar1 + -0x10,(uint)*pbVar1,0x10);
    memset(pbVar1 + in_ESI,(uint)pbVar1[in_ESI + -1],0x10);
  }
  for (local_28 = -0x10; local_28 < 0; local_28 = local_28 + 1) {
    memcpy((void *)(in_RDI + local_28 * in_ECX + -0x10),(void *)(in_RDI + -0x10),
           (long)(in_ESI + 0x20));
  }
  for (local_3c = in_EDX; local_3c < in_EDX + 0x10; local_3c = local_3c + 1) {
    memcpy((void *)(in_RDI + local_3c * in_ECX + -0x10),
           (void *)(in_RDI + (in_EDX + -1) * in_ECX + -0x10),(long)(in_ESI + 0x20));
  }
  return;
}

Assistant:

static inline void fill_border(uint8_t *img_buf, const int width,
                               const int height, const int stride) {
  // Fill left and right areas
  for (int row = 0; row < height; row++) {
    uint8_t *row_start = &img_buf[row * stride];
    uint8_t left_pixel = row_start[0];
    memset(row_start - PYRAMID_PADDING, left_pixel, PYRAMID_PADDING);
    uint8_t right_pixel = row_start[width - 1];
    memset(row_start + width, right_pixel, PYRAMID_PADDING);
  }

  // Fill top area
  for (int row = -PYRAMID_PADDING; row < 0; row++) {
    uint8_t *row_start = &img_buf[row * stride];
    memcpy(row_start - PYRAMID_PADDING, img_buf - PYRAMID_PADDING,
           width + 2 * PYRAMID_PADDING);
  }

  // Fill bottom area
  uint8_t *last_row_start = &img_buf[(height - 1) * stride];
  for (int row = height; row < height + PYRAMID_PADDING; row++) {
    uint8_t *row_start = &img_buf[row * stride];
    memcpy(row_start - PYRAMID_PADDING, last_row_start - PYRAMID_PADDING,
           width + 2 * PYRAMID_PADDING);
  }
}